

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

void __thiscall implementations::scheme::SchemeFrame::setExpression(SchemeFrame *this,cell *value)

{
  bool bVar1;
  cell val;
  cell cStack_78;
  
  this->resolved = false;
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::clear
            (&this->arguments);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::clear
            (&this->resolved_arguments);
  cell::cell(&cStack_78,value);
  bVar1 = resolveExpression(this,&cStack_78);
  (this->arg_it)._M_current =
       (this->arguments).
       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (bVar1) {
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    clear(&this->resolved_arguments);
    this->resolved = true;
  }
  else {
    nextArgument(this);
  }
  cell::~cell(&cStack_78);
  return;
}

Assistant:

void setExpression(const cell &value) {
		DEBUG("setExpression(" + to_string(value) + ")");
		resolved = false;
		arguments.clear();
		resolved_arguments.clear();
		cell val(value);
		if (resolveExpression(val)) {
			arg_it = arguments.cbegin();
			resolved_arguments.clear();
			resolved = true;
			return;
		}
		arg_it = arguments.cbegin();
		nextArgument();
	}